

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

int m256v_LU_decomp_inplace(m256v *A,int *rp,int *cp)

{
  int iVar1;
  uint8_t alpha;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int r1;
  ulong uVar7;
  ulong uVar8;
  long local_48;
  
  if (0 < A->n_row) {
    lVar2 = 0;
    do {
      rp[lVar2] = (int)lVar2;
      lVar2 = lVar2 + 1;
    } while (lVar2 < A->n_row);
  }
  if (0 < A->n_col) {
    lVar2 = 0;
    do {
      cp[lVar2] = (int)lVar2;
      lVar2 = lVar2 + 1;
    } while (lVar2 < A->n_col);
  }
  uVar4 = (ulong)(uint)A->n_col;
  if (A->n_col < 1) {
    uVar7 = 0;
  }
  else {
    local_48 = 1;
    uVar7 = 0;
    while (((long)uVar7 < (long)A->n_row && ((long)uVar7 < (long)(int)uVar4))) {
      puVar5 = A->e + (A->rstride + 1) * uVar7;
      uVar8 = uVar7;
LAB_00102eef:
      uVar3 = uVar7;
      puVar6 = puVar5;
      while (*puVar6 == '\0') {
        uVar3 = uVar3 + 1;
        puVar6 = puVar6 + A->rstride;
        if ((uint)A->n_row == uVar3) goto code_r0x00102f06;
      }
      r1 = (int)uVar7;
      if ((uVar3 & 0xffffffff) != uVar7) {
        iVar1 = rp[uVar3 & 0xffffffff];
        rp[uVar3 & 0xffffffff] = rp[uVar7];
        rp[uVar7] = iVar1;
        m256v_swap_rows(A,r1,(int)uVar3);
      }
      if ((uVar8 & 0xffffffff) != uVar7) {
        iVar1 = cp[uVar8 & 0xffffffff];
        cp[uVar8 & 0xffffffff] = cp[uVar7];
        cp[uVar7] = iVar1;
        m256v_swap_cols(A,(int)uVar8,r1);
      }
      alpha = gf256_inv(A->e[uVar7 + A->rstride * uVar7]);
      uVar3 = uVar7 + 1;
      m256v_mult_col_from(A,r1,r1 + 1,alpha);
      lVar2 = local_48;
      if ((long)uVar3 < (long)A->n_row) {
        do {
          m256v_multadd_row_from(A,r1,r1 + 1,A->e[uVar7 + A->rstride * lVar2],A,(int)lVar2);
          lVar2 = lVar2 + 1;
        } while ((int)lVar2 < A->n_row);
      }
      if ((long)(int)uVar4 <= (long)uVar8) break;
      uVar4 = (ulong)A->n_col;
      local_48 = local_48 + 1;
      uVar7 = uVar3;
      if ((long)uVar4 <= (long)uVar3) break;
    }
  }
LAB_00102ff7:
  return (int)uVar7;
code_r0x00102f06:
  uVar8 = uVar8 + 1;
  puVar5 = puVar5 + 1;
  if (uVar8 == (uVar4 & 0xffffffff)) goto LAB_00102ff7;
  goto LAB_00102eef;
}

Assistant:

int MV_GEN_N(_LU_decomp_inplace)(MV_GEN_TYPE* A,
				int* rp,
				int* cp)
{
	/* Initialize permutations */
	int i;
	for (i = 0; i < A->n_row; ++i)
		rp[i] = i;
	for (i = 0; i < A->n_col; ++i)
		cp[i] = i;

	/* LU decomposition */
	for (i = 0; i < A->n_col && i < A->n_row; ++i) {
		/* Find a pivot
		 *
		 * We must pick in A to process that does not lead to a
		 * zero value on the diagonal of U, for otherwise we
		 * can't keep processing.
		 *
		 * Find a row such that the resulting U[i,i]
		 * will be nonzero.
		 */
		int prow;
		int pcol;
		for (pcol = i; pcol < A->n_col; ++pcol) {
			for (prow = i; prow < A->n_row; ++prow) {
				if (MV_GEN_N(_get_el)(A, prow, pcol) != 0) {
					goto pivot_found;
				}
			}
		}

		/* No pivot found; maximum rank reached */
		assert (pcol == A->n_col);
		break;
pivot_found:

		/* Permute row and column to get pivot into place,
		   and record */
		if (prow != i) {
			SwapInt(rp[i], rp[prow]);
			MV_GEN_N(_swap_rows)(A, i, prow);
		}
		if (pcol != i) {
			SwapInt(cp[i], cp[pcol]);
			MV_GEN_N(_swap_cols)(A, pcol, i);
		}

		/* At this point, the row i of U is computed correctly
		 * already, due to the updates to a (see below, "update
		 * A in the undecomposed part").  The column i of L is
		 * not quite correct yet; we need to divide the entries
		 * by Uii.
		 */

		/* Compute the column i of L */
		MV_GEN_ELTYPE Uii_inv = finv(MV_GEN_N(_get_el)(A, i, i));
		MV_GEN_N(_mult_col_from)(A, i, i + 1, Uii_inv);

		/* Update A in the yet undecomposed part */
		for (int j = i + 1; j < A->n_row; ++j) {
			const MV_GEN_ELTYPE Lji = MV_GEN_N(_get_el)(A, j, i);
			MV_GEN_N(_multadd_row_from)(A, i, i + 1, Lji, A, j);
		}
	}

	/* At this point, i is the rank of the matrix */
	return i;
}